

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blk_sse_sum_sse2.c
# Opt level: O0

void sse_sum_wd8_sse2(int16_t *data,int stride,int bh,int *x_sum,int64_t *x2_sum,int loop_cycles)

{
  int *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  long *in_R8;
  int in_R9D;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i temp_buffer1;
  int16_t *data_tmp;
  int local_290;
  int local_28c;
  uint local_258;
  uint uStack_254;
  uint uStack_250;
  uint uStack_24c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  undefined1 (*local_200) [16];
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_e8;
  int iStack_e4;
  int iStack_e0;
  int iStack_dc;
  int j;
  int i;
  __m128i sse_buffer;
  __m128i sum_buffer;
  __m128i load_pixels;
  __m128i regx2_sum;
  __m128i regx_sum;
  __m128i one;
  __m128i temp_buffer2;
  
  local_248 = 0;
  iStack_244 = 0;
  iStack_240 = 0;
  iStack_23c = 0;
  local_258 = 0;
  uStack_254 = 0;
  uStack_250 = 0;
  uStack_24c = 0;
  for (local_28c = 0; local_28c < in_R9D; local_28c = local_28c + 1) {
    local_200 = (undefined1 (*) [16])(in_RDI + (long)(local_28c << 3) * 2);
    for (local_290 = 0; local_290 < in_EDX; local_290 = local_290 + 1) {
      auVar1._8_8_ = 0x1000100010001;
      auVar1._0_8_ = 0x1000100010001;
      auVar1 = pmaddwd(*local_200,auVar1);
      auVar2 = pmaddwd(*local_200,*local_200);
      local_e8 = auVar1._0_4_;
      iStack_e4 = auVar1._4_4_;
      iStack_e0 = auVar1._8_4_;
      iStack_dc = auVar1._12_4_;
      local_248 = local_e8 + local_248;
      iStack_244 = iStack_e4 + iStack_244;
      iStack_240 = iStack_e0 + iStack_240;
      iStack_23c = iStack_dc + iStack_23c;
      local_108 = auVar2._0_4_;
      iStack_104 = auVar2._4_4_;
      iStack_100 = auVar2._8_4_;
      iStack_fc = auVar2._12_4_;
      local_258 = local_108 + local_258;
      uStack_254 = iStack_104 + uStack_254;
      uStack_250 = iStack_100 + uStack_250;
      uStack_24c = iStack_fc + uStack_24c;
      local_200 = (undefined1 (*) [16])(*local_200 + (long)in_ESI * 2);
    }
  }
  *in_RCX = *in_RCX + local_248 + iStack_240 + iStack_244 + iStack_23c;
  *in_R8 = (ulong)local_258 + (ulong)uStack_250 + (ulong)uStack_254 + (ulong)uStack_24c + *in_R8;
  return;
}

Assistant:

static inline void sse_sum_wd8_sse2(const int16_t *data, int stride, int bh,
                                    int *x_sum, int64_t *x2_sum,
                                    int loop_cycles) {
  const int16_t *data_tmp;
  __m128i temp_buffer1, temp_buffer2;
  __m128i one = _mm_set1_epi16(1);
  __m128i regx_sum = _mm_setzero_si128();
  __m128i regx2_sum = regx_sum;
  __m128i load_pixels, sum_buffer, sse_buffer;

  for (int i = 0; i < loop_cycles; ++i) {
    data_tmp = data + (8 * i);
    for (int j = 0; j < bh; ++j) {
      // Load 1 row (8-pixels) at a time.
      load_pixels = _mm_loadu_si128((__m128i const *)(data_tmp));
      sum_buffer = _mm_madd_epi16(load_pixels, one);
      sse_buffer = _mm_madd_epi16(load_pixels, load_pixels);
      regx_sum = _mm_add_epi32(sum_buffer, regx_sum);
      regx2_sum = _mm_add_epi32(sse_buffer, regx2_sum);
      data_tmp += stride;
    }
  }

  regx_sum = _mm_add_epi32(regx_sum, _mm_srli_si128(regx_sum, 8));
  regx_sum = _mm_add_epi32(regx_sum, _mm_srli_si128(regx_sum, 4));
  *x_sum += _mm_cvtsi128_si32(regx_sum);
  temp_buffer1 = _mm_unpacklo_epi32(regx2_sum, _mm_setzero_si128());
  temp_buffer2 = _mm_unpackhi_epi32(regx2_sum, _mm_setzero_si128());
  regx2_sum = _mm_add_epi64(temp_buffer1, temp_buffer2);
  regx2_sum = _mm_add_epi64(regx2_sum, _mm_srli_si128(regx2_sum, 8));
#if AOM_ARCH_X86_64
  *x2_sum += _mm_cvtsi128_si64(regx2_sum);
#else
  {
    int64_t tmp;
    _mm_storel_epi64((__m128i *)&tmp, regx2_sum);
    *x2_sum += tmp;
  }
#endif
}